

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

TValue * lj_meta_comp(lua_State *L,cTValue *o1,cTValue *o2,int op)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  cTValue *pcVar4;
  cTValue *pcVar5;
  uint uVar6;
  TValue *pTVar7;
  ulong uVar8;
  code *pcVar9;
  MMS mm;
  TValue *unaff_R13;
  
  pcVar4 = o1;
  if (((o1->field_2).it == 0xfffffff5) || (pcVar4 = o2, (o2->field_2).it == 0xfffffff5)) {
    pcVar4 = lj_meta_lookup(L,pcVar4,MM_le - ((op & 2U) == 0));
    uVar1 = (pcVar4->field_2).it;
    if (uVar1 != 0xffffffff) {
      uVar8 = (ulong)L->base[-1].u32.lo;
      if (*(char *)(uVar8 + 6) == '\0') {
        pTVar7 = L->base + *(byte *)((ulong)*(uint *)(uVar8 + 0x10) - 0x39);
      }
      else {
        pTVar7 = L->top;
      }
      pcVar9 = lj_cont_condf;
      if ((op & 1U) == 0) {
        pcVar9 = lj_cont_condt;
      }
      pTVar7->u64 = (uint64_t)(pcVar9 + -0x14e0c0);
      pTVar7[1] = *pcVar4;
      unaff_R13 = pTVar7 + 2;
      pTVar7[2] = *o1;
      pTVar7[3] = *o2;
    }
    if (uVar1 == 0xffffffff) {
LAB_0010bcae:
      lj_err_comp(L,o1,o2);
    }
  }
  else {
    pcVar4 = o1;
    if ((o2->field_2).it == 0xfffffffb && (o1->field_2).it == 0xfffffffb) {
      uVar2 = lj_str_cmp((GCstr *)(ulong)(o1->u32).lo,(GCstr *)(ulong)(o2->u32).lo);
      uVar6 = (uint)((int)uVar2 < 1);
      if ((op & 2U) == 0) {
        uVar6 = uVar2 >> 0x1f;
      }
      unaff_R13 = (TValue *)(ulong)(op & 1U ^ uVar6);
    }
    else {
      do {
        mm = MM_le - ((op & 2U) == 0);
        pcVar5 = lj_meta_lookup(L,pcVar4,mm);
        o1 = pcVar4;
        if (((pcVar5->field_2).it == 0xffffffff) &&
           (pcVar5 = lj_meta_lookup(L,o2,mm), (pcVar5->field_2).it == 0xffffffff)) {
          iVar3 = 2;
          if ((op & 2U) != 0) {
            op = op ^ 3;
            iVar3 = 4;
            o1 = o2;
            o2 = pcVar4;
          }
        }
        else {
          uVar8 = (ulong)L->base[-1].u32.lo;
          if (*(char *)(uVar8 + 6) == '\0') {
            pTVar7 = L->base + *(byte *)((ulong)*(uint *)(uVar8 + 0x10) - 0x39);
          }
          else {
            pTVar7 = L->top;
          }
          pcVar9 = lj_cont_condf;
          if ((op & 1U) == 0) {
            pcVar9 = lj_cont_condt;
          }
          pTVar7->u64 = (uint64_t)(pcVar9 + -0x14e0c0);
          pTVar7[1] = *pcVar5;
          unaff_R13 = pTVar7 + 2;
          pTVar7[2] = *pcVar4;
          pTVar7[3] = *o2;
          iVar3 = 1;
        }
        pcVar4 = o1;
      } while (iVar3 == 4);
      if (iVar3 != 1) goto LAB_0010bcae;
    }
  }
  return unaff_R13;
}

Assistant:

TValue *lj_meta_comp(lua_State *L, cTValue *o1, cTValue *o2, int op)
{
  if (LJ_HASFFI && (tviscdata(o1) || tviscdata(o2))) {
    ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
    MMS mm = (op & 2) ? MM_le : MM_lt;
    cTValue *mo = lj_meta_lookup(L, tviscdata(o1) ? o1 : o2, mm);
    if (LJ_UNLIKELY(tvisnil(mo))) goto err;
    return mmcall(L, cont, mo, o1, o2);
  } else if (LJ_52 || itype(o1) == itype(o2)) {
    /* Never called with two numbers. */
    if (tvisstr(o1) && tvisstr(o2)) {
      int32_t res = lj_str_cmp(strV(o1), strV(o2));
      return (TValue *)(intptr_t)(((op&2) ? res <= 0 : res < 0) ^ (op&1));
    } else {
    trymt:
      while (1) {
	ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
	MMS mm = (op & 2) ? MM_le : MM_lt;
	cTValue *mo = lj_meta_lookup(L, o1, mm);
#if LJ_52
	if (tvisnil(mo) && tvisnil((mo = lj_meta_lookup(L, o2, mm))))
#else
	cTValue *mo2 = lj_meta_lookup(L, o2, mm);
	if (tvisnil(mo) || !lj_obj_equal(mo, mo2))
#endif
	{
	  if (op & 2) {  /* MM_le not found: retry with MM_lt. */
	    cTValue *ot = o1; o1 = o2; o2 = ot;  /* Swap operands. */
	    op ^= 3;  /* Use LT and flip condition. */
	    continue;
	  }
	  goto err;
	}
	return mmcall(L, cont, mo, o1, o2);
      }
    }
  } else if (tvisbool(o1) && tvisbool(o2)) {
    goto trymt;
  } else {
  err:
    lj_err_comp(L, o1, o2);
    return NULL;
  }
}